

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::FillCacheManagerFromUI(cmCursesMainForm *this)

{
  cmCursesCacheEntryComposite *pcVar1;
  pointer pcVar2;
  int iVar3;
  CacheEntryType type;
  char *__s;
  size_t sVar4;
  undefined4 extraout_var;
  _Alloc_hider _Var5;
  cmState *pcVar6;
  long lVar7;
  string fixedNewValue;
  string fixedOldValue;
  string oldValue;
  string newValue;
  string cacheKey;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  long local_78;
  string local_70;
  string local_50;
  
  local_78 = (long)(this->Entries->
                   super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Entries->
                   super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  if (local_78 != 0) {
    local_78 = local_78 >> 3;
    local_78 = local_78 + (ulong)(local_78 == 0);
    lVar7 = 0;
    do {
      pcVar1 = (this->Entries->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar7];
      pcVar2 = (pcVar1->Key)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (pcVar1->Key)._M_string_length);
      __s = cmState::GetCacheEntryValue(this->CMakeInstance->State,&local_50);
      if (__s != (char *)0x0) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        sVar4 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,__s,__s + sVar4);
        iVar3 = (*(this->Entries->
                  super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                  )._M_impl.super__Vector_impl_data._M_start[lVar7]->Entry->_vptr_cmCursesWidget[5])
                          ();
        std::__cxx11::string::string
                  ((string *)&local_70,(char *)CONCAT44(extraout_var,iVar3),(allocator *)&local_d8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        local_f8._M_string_length = 0;
        local_f8.field_2._M_local_buf[0] = '\0';
        pcVar6 = this->CMakeInstance->State;
        type = cmState::GetCacheEntryType(pcVar6,&local_50);
        FixValue((cmCursesMainForm *)pcVar6,type,&local_b8,&local_d8);
        FixValue((cmCursesMainForm *)pcVar6,type,&local_70,&local_f8);
        _Var5._M_p = local_f8._M_dataplus._M_p;
        if (local_d8._M_string_length == local_f8._M_string_length) {
          if (local_d8._M_string_length != 0) {
            iVar3 = bcmp(local_d8._M_dataplus._M_p,local_f8._M_dataplus._M_p,
                         local_d8._M_string_length);
            if (iVar3 != 0) goto LAB_00227dcf;
          }
        }
        else {
LAB_00227dcf:
          pcVar6 = this->CMakeInstance->State;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"MODIFIED","");
          cmState::SetCacheEntryBoolProperty(pcVar6,&local_50,&local_98,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          cmState::SetCacheEntryValue(this->CMakeInstance->State,&local_50,&local_f8);
          _Var5._M_p = local_f8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var5._M_p != &local_f8.field_2) {
          operator_delete(_Var5._M_p,
                          CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                   local_f8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,
                          CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                   local_d8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
    } while (local_78 != lVar7);
  }
  return;
}

Assistant:

void cmCursesMainForm::FillCacheManagerFromUI()
{
  size_t size = this->Entries->size();
  for(size_t i=0; i < size; i++)
    {
    std::string cacheKey = (*this->Entries)[i]->Key;
      const char* existingValue = this->CMakeInstance->GetState()
        ->GetCacheEntryValue(cacheKey);
    if (existingValue)
      {
      std::string oldValue = existingValue;
      std::string newValue = (*this->Entries)[i]->Entry->GetValue();
      std::string fixedOldValue;
      std::string fixedNewValue;
      cmState::CacheEntryType t =
          this->CMakeInstance->GetState()
              ->GetCacheEntryType(cacheKey);
      this->FixValue(t, oldValue, fixedOldValue);
      this->FixValue(t, newValue, fixedNewValue);

      if(!(fixedOldValue == fixedNewValue))
        {
        // The user has changed the value.  Mark it as modified.
        this->CMakeInstance->GetState()
            ->SetCacheEntryBoolProperty(cacheKey, "MODIFIED", true);
        this->CMakeInstance->GetState()
            ->SetCacheEntryValue(cacheKey, fixedNewValue);
        }
      }
    }
}